

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cc
# Opt level: O0

void cnn::RemoveArgs(int *argc,char ***argv,int *argi,int n)

{
  int in_ECX;
  int *in_RDX;
  long *in_RSI;
  int *in_RDI;
  int i;
  int local_20;
  
  for (local_20 = *in_RDX + in_ECX; local_20 < *in_RDI; local_20 = local_20 + 1) {
    *(undefined8 *)(*in_RSI + (long)(local_20 - in_ECX) * 8) =
         *(undefined8 *)(*in_RSI + (long)local_20 * 8);
  }
  *in_RDI = *in_RDI - in_ECX;
  if (-1 < *in_RDI) {
    return;
  }
  __assert_fail("argc >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/init.cc"
                ,0x1e,"void cnn::RemoveArgs(int &, char **&, int &, int)");
}

Assistant:

static void RemoveArgs(int& argc, char**& argv, int& argi, int n) {
  for (int i = argi + n; i < argc; ++i)
    argv[i - n] = argv[i];
  argc -= n;
  assert(argc >= 0);
}